

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

bool __thiscall
ON_NurbsSurface::Split
          (ON_NurbsSurface *this,int dir,double c,ON_Surface **west_or_south_side,
          ON_Surface **east_or_north_side)

{
  double *pdVar1;
  double *pdVar2;
  bool bVar3;
  ON_NurbsCurve *pOVar4;
  ON_NurbsSurface *this_00;
  ulong uVar5;
  ON_NurbsSurface *this_01;
  int iVar6;
  uint uVar7;
  ON_Curve *right_side;
  ON_Curve *left_side;
  ON_NurbsCurve crv;
  ON_NurbsCurve right_crv;
  ON_NurbsCurve left_crv;
  ON_NurbsCurve *local_100;
  ON_NurbsCurve *local_f8;
  ON_NurbsCurve local_f0;
  ON_NurbsCurve local_b0;
  ON_NurbsCurve local_70;
  
  if (1 < (uint)dir) {
    return false;
  }
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
  bVar3 = ON_Interval::Includes((ON_Interval *)&local_f0,c,true);
  if (!bVar3) {
    return false;
  }
  this_00 = (ON_NurbsSurface *)*west_or_south_side;
  if (this_00 != (ON_NurbsSurface *)0x0) {
    bVar3 = ON_Object::IsKindOf((ON_Object *)this_00,&m_ON_NurbsSurface_class_rtti);
    if (!bVar3) {
      return false;
    }
    ON_Surface::DestroySurfaceTree((ON_Surface *)this_00);
  }
  this_01 = (ON_NurbsSurface *)*east_or_north_side;
  if (this_01 != (ON_NurbsSurface *)0x0) {
    bVar3 = ON_Object::IsKindOf((ON_Object *)this_01,&m_ON_NurbsSurface_class_rtti);
    if (!bVar3) {
      return false;
    }
    ON_Surface::DestroySurfaceTree((ON_Surface *)this_01);
  }
  ON_NurbsCurve::ON_NurbsCurve(&local_f0);
  ON_NurbsCurve::ON_NurbsCurve(&local_70);
  ON_NurbsCurve::ON_NurbsCurve(&local_b0);
  pOVar4 = ToCurve(this,dir,&local_f0);
  if ((pOVar4 != (ON_NurbsCurve *)0x0) &&
     (local_100 = &local_b0, local_f8 = &local_70,
     bVar3 = ON_NurbsCurve::Split(&local_f0,c,(ON_Curve **)&local_f8,(ON_Curve **)&local_100), bVar3
     )) {
    if (this_00 == (ON_NurbsSurface *)0x0) {
      this_00 = (ON_NurbsSurface *)operator_new(0x58);
      ON_NurbsSurface(this_00);
    }
    if (this_00 != this) {
      iVar6 = this->m_is_rat;
      this_00->m_dim = this->m_dim;
      this_00->m_is_rat = iVar6;
      iVar6 = dir + -1;
      bVar3 = iVar6 != 0;
      uVar7 = -iVar6;
      uVar5 = (ulong)(uint)(iVar6 * -4);
      *(undefined4 *)((long)this_00->m_order + uVar5) = *(undefined4 *)((long)this->m_order + uVar5)
      ;
      *(undefined4 *)((long)this_00->m_cv_count + uVar5) =
           *(undefined4 *)((long)this->m_cv_count + uVar5);
      iVar6 = ON_KnotCount(*(int *)((long)this->m_order + (ulong)((uint)bVar3 * 4)),
                           *(int *)((long)this->m_cv_count + (ulong)((uint)bVar3 * 4)));
      ReserveKnotCapacity(this_00,uVar7,iVar6);
      pdVar1 = this_00->m_knot[uVar7];
      pdVar2 = this->m_knot[uVar7];
      iVar6 = ON_KnotCount(this->m_order[bVar3],this->m_cv_count[bVar3]);
      memcpy(pdVar1,pdVar2,(long)iVar6 << 3);
    }
    bVar3 = FromCurve(&local_70,this_00,dir);
    if (bVar3) {
      if (this_01 == (ON_NurbsSurface *)0x0) {
        this_01 = (ON_NurbsSurface *)operator_new(0x58);
        ON_NurbsSurface(this_01);
      }
      if (this_01 != this) {
        iVar6 = this->m_is_rat;
        this_01->m_dim = this->m_dim;
        this_01->m_is_rat = iVar6;
        iVar6 = dir + -1;
        bVar3 = iVar6 != 0;
        uVar7 = -iVar6;
        uVar5 = (ulong)(uint)(iVar6 * -4);
        *(undefined4 *)((long)this_01->m_order + uVar5) =
             *(undefined4 *)((long)this->m_order + uVar5);
        *(undefined4 *)((long)this_01->m_cv_count + uVar5) =
             *(undefined4 *)((long)this->m_cv_count + uVar5);
        iVar6 = ON_KnotCount(*(int *)((long)this->m_order + (ulong)((uint)bVar3 * 4)),
                             *(int *)((long)this->m_cv_count + (ulong)((uint)bVar3 * 4)));
        ReserveKnotCapacity(this_01,uVar7,iVar6);
        pdVar1 = this_01->m_knot[uVar7];
        pdVar2 = this->m_knot[uVar7];
        iVar6 = ON_KnotCount(this->m_order[bVar3],this->m_cv_count[bVar3]);
        memcpy(pdVar1,pdVar2,(long)iVar6 << 3);
      }
      bVar3 = FromCurve(&local_b0,this_01,dir);
      if (bVar3) {
        if ((ON_NurbsSurface *)*west_or_south_side == (ON_NurbsSurface *)0x0) {
          *west_or_south_side = &this_00->super_ON_Surface;
        }
        bVar3 = true;
        if (*east_or_north_side == (ON_Surface *)0x0) {
          *east_or_north_side = &this_01->super_ON_Surface;
        }
        goto LAB_005450f0;
      }
      if (this_00 == (ON_NurbsSurface *)*west_or_south_side || this_00 == this) {
        Destroy(this_00);
      }
      else {
        (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
      }
      this_00 = this_01;
      if ((this_01 != this) && (this_01 != (ON_NurbsSurface *)*east_or_north_side))
      goto LAB_005450e1;
    }
    else if ((this_00 != this) && (this_00 != (ON_NurbsSurface *)*west_or_south_side)) {
LAB_005450e1:
      (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
      goto LAB_005450ee;
    }
    Destroy(this_00);
  }
LAB_005450ee:
  bVar3 = false;
LAB_005450f0:
  ON_NurbsCurve::~ON_NurbsCurve(&local_b0);
  ON_NurbsCurve::~ON_NurbsCurve(&local_70);
  ON_NurbsCurve::~ON_NurbsCurve(&local_f0);
  return bVar3;
}

Assistant:

bool ON_NurbsSurface::Split(
       int dir,
       double c,
       ON_Surface*& west_or_south_side,
       ON_Surface*& east_or_north_side
       ) const
{
  if ( dir < 0 || dir > 1 )
    return false;
  if ( !Domain(dir).Includes( c, true ) )
    return false;
  ON_NurbsSurface* left_srf = 0;
  ON_NurbsSurface* right_srf = 0;

  if ( west_or_south_side )
  {
    left_srf = ON_NurbsSurface::Cast( west_or_south_side );
    if ( !left_srf )
      return false;
    left_srf->DestroySurfaceTree();
  }

  if ( east_or_north_side )
  {
    right_srf = ON_NurbsSurface::Cast( east_or_north_side );
    if ( !right_srf )
      return false;
    right_srf->DestroySurfaceTree();
  }

  ON_NurbsCurve crv, left_crv, right_crv;
  if ( !ToCurve( *this, dir, &crv ) )
    return false;
  ON_Curve *left_side, *right_side;
  left_side = &left_crv;
  right_side = &right_crv;
  if ( !crv.Split( c, left_side, right_side ) )
    return false;
  
  if ( !left_srf )
    left_srf = new ON_NurbsSurface();

  if ( left_srf != this )
  {
    left_srf->m_dim = m_dim;
    left_srf->m_is_rat = m_is_rat;
    left_srf->m_order[1-dir] = m_order[1-dir];
    left_srf->m_cv_count[1-dir] = m_cv_count[1-dir];
    left_srf->ReserveKnotCapacity(1-dir,KnotCount(1-dir));
    memcpy( left_srf->m_knot[1-dir], m_knot[1-dir], KnotCount(1-dir)*sizeof(m_knot[1-dir][0] ) );
  }

  if ( !FromCurve( left_crv, *left_srf, dir ) )
  {
    if ( left_srf != this && left_srf !=  west_or_south_side )
      delete left_srf;
    else
      left_srf->Destroy();

    return false;
  }

  if ( !right_srf )
    right_srf = new ON_NurbsSurface();

  if ( right_srf != this )
  {
    right_srf->m_dim = m_dim;
    right_srf->m_is_rat = m_is_rat;
    right_srf->m_order[1-dir] = m_order[1-dir];
    right_srf->m_cv_count[1-dir] = m_cv_count[1-dir];
    right_srf->ReserveKnotCapacity(1-dir,KnotCount(1-dir));
    memcpy( right_srf->m_knot[1-dir], m_knot[1-dir], KnotCount(1-dir)*sizeof(m_knot[1-dir][0] ) );
  }

  if ( !FromCurve( right_crv, *right_srf, dir ) )
  {
    if ( left_srf != this && left_srf !=  west_or_south_side )
      delete left_srf;
    else
      left_srf->Destroy();

    if ( right_srf != this && right_srf !=  east_or_north_side )
      delete right_srf;
    else
      right_srf->Destroy();

    return false;
  }

  if ( !west_or_south_side)
    west_or_south_side = left_srf;

  if ( !east_or_north_side)
    east_or_north_side = right_srf;

  return true;  
}